

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  ImVec2 *local_78;
  ImVec2 *local_58;
  int local_4c;
  int local_48;
  int i_3;
  int i_2;
  int i_1;
  ImVec2 local_38;
  ImVec2 local_30;
  int local_28;
  int i;
  ImVec2 local_18;
  ImGuiIO *local_10;
  ImGuiIO *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->DisplaySize);
  ImVec2::ImVec2(&this->DisplayFramebufferScale);
  ImVec2::ImVec2(&this->MousePos);
  ImVec2::ImVec2(&this->MouseDelta);
  ImVec2::ImVec2(&this->MousePosPrev);
  local_58 = this->MouseClickedPos;
  do {
    ImVec2::ImVec2(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (ImVec2 *)this->MouseClickedTime);
  local_78 = this->MouseDragMaxDistanceAbs;
  do {
    ImVec2::ImVec2(local_78);
    local_78 = local_78 + 1;
  } while (local_78 != (ImVec2 *)this->MouseDragMaxDistanceSqr);
  ImVector<unsigned_short>::ImVector(&this->InputQueueCharacters);
  memset(this,0,0x1550);
  this->ConfigFlags = 0;
  this->BackendFlags = 0;
  ImVec2::ImVec2(&local_18,-1.0,-1.0);
  this->DisplaySize = local_18;
  this->DeltaTime = 0.016666668;
  this->IniSavingRate = 5.0;
  this->IniFilename = "imgui.ini";
  this->LogFilename = "imgui_log.txt";
  this->MouseDoubleClickTime = 0.3;
  this->MouseDoubleClickMaxDist = 6.0;
  for (local_28 = 0; local_28 < 0x16; local_28 = local_28 + 1) {
    this->KeyMap[local_28] = -1;
  }
  this->KeyRepeatDelay = 0.275;
  this->KeyRepeatRate = 0.05;
  this->UserData = (void *)0x0;
  this->Fonts = (ImFontAtlas *)0x0;
  this->FontGlobalScale = 1.0;
  this->FontDefault = (ImFont *)0x0;
  this->FontAllowUserScaling = false;
  ImVec2::ImVec2(&local_30,1.0,1.0);
  this->DisplayFramebufferScale = local_30;
  this->MouseDrawCursor = false;
  this->ConfigMacOSXBehaviors = false;
  this->ConfigInputTextCursorBlink = true;
  this->ConfigWindowsResizeFromEdges = true;
  this->ConfigWindowsMoveFromTitleBarOnly = false;
  this->ConfigWindowsMemoryCompactTimer = 60.0;
  this->BackendRendererName = (char *)0x0;
  this->BackendPlatformName = (char *)0x0;
  this->BackendLanguageUserData = (void *)0x0;
  this->BackendRendererUserData = (void *)0x0;
  this->BackendPlatformUserData = (void *)0x0;
  this->GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;
  this->SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
  this->ClipboardUserData = (void *)0x0;
  this->ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
  this->ImeWindowHandle = (void *)0x0;
  this->RenderDrawListsFn = (_func_void_ImDrawData_ptr *)0x0;
  ImVec2::ImVec2(&local_38,-3.4028235e+38,-3.4028235e+38);
  this->MousePos = local_38;
  ImVec2::ImVec2((ImVec2 *)&i_2,-3.4028235e+38,-3.4028235e+38);
  this->MousePosPrev = _i_2;
  this->MouseDragThreshold = 6.0;
  for (i_3 = 0; i_3 < 5; i_3 = i_3 + 1) {
    this->MouseDownDurationPrev[i_3] = -1.0;
    this->MouseDownDuration[i_3] = -1.0;
  }
  for (local_48 = 0; local_48 < 0x200; local_48 = local_48 + 1) {
    this->KeysDownDurationPrev[local_48] = -1.0;
    this->KeysDownDuration[local_48] = -1.0;
  }
  for (local_4c = 0; local_4c < 0x15; local_4c = local_4c + 1) {
    this->NavInputsDownDuration[local_4c] = -1.0;
  }
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));
    IM_ASSERT(IM_ARRAYSIZE(ImGuiIO::MouseDown) == ImGuiMouseButton_COUNT && IM_ARRAYSIZE(ImGuiIO::MouseClicked) == ImGuiMouseButton_COUNT); // Our pre-C++11 IM_STATIC_ASSERT() macros triggers warning on modern compilers so we don't use it here.

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f/60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.275f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);

    // Miscellaneous options
    MouseDrawCursor = false;
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;
    ConfigWindowsMemoryCompactTimer = 60.0f;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
    ImeWindowHandle = NULL;

#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    RenderDrawListsFn = NULL;
#endif

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++) KeysDownDuration[i]  = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
}